

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidation_tests.cpp
# Opt level: O0

void __thiscall
txvalidation_tests::tx_mempool_reject_coinbase::test_method(tx_mempool_reject_coinbase *this)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  bool bVar1;
  reference pvVar2;
  unsigned_long uVar3;
  long in_FS_OFFSET;
  uint initialPoolSize;
  CMutableTransaction coinbaseTx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  MempoolAcceptResult result;
  CScript scriptPubKey;
  char *in_stack_fffffffffffff978;
  ValidationState<TxValidationResult> *in_stack_fffffffffffff980;
  char *in_stack_fffffffffffff988;
  size_type in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff998;
  undefined1 fTry;
  int in_stack_fffffffffffff99c;
  lazy_ostream *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  TxValidationResult in_stack_fffffffffffff9ac;
  CMutableTransaction *in_stack_fffffffffffff9b0;
  const_string *file;
  undefined7 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9bf;
  undefined8 in_stack_fffffffffffff9e8;
  undefined1 test_accept;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  ChainstateManager *in_stack_fffffffffffff9f8;
  const_string local_548 [2];
  lazy_ostream local_528 [2];
  assertion_result local_508;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [64];
  const_string local_480 [2];
  lazy_ostream local_460 [2];
  assertion_result local_440 [2];
  unsigned_long local_408;
  undefined1 local_400 [16];
  undefined1 local_3f0 [64];
  const_string local_3b0 [2];
  lazy_ostream local_390 [2];
  assertion_result local_370 [3];
  undefined1 local_324 [36];
  lazy_ostream local_300 [2];
  assertion_result local_2e0 [4];
  undefined4 local_278;
  undefined1 local_238 [384];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  CScript::CScript((CScript *)in_stack_fffffffffffff978);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff9a0);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff988,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff980);
  b._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff9b8;
  b._M_ptr = (pointer)in_stack_fffffffffffff9b0;
  b._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff9bf;
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),b);
  CScript::operator<<((CScript *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
  CScript::CScript((CScript *)in_stack_fffffffffffff978,(CScript *)0xbc63b6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff988);
  CScript::~CScript((CScript *)in_stack_fffffffffffff978);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff978);
  local_278 = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),in_stack_fffffffffffff990
            );
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),in_stack_fffffffffffff990
            );
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  CScript::CScript((CScript *)in_stack_fffffffffffff978);
  CScript::operator<<((CScript *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
  CScript::operator<<((CScript *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff988,
             (size_type)in_stack_fffffffffffff980);
  CScript::operator=((CScript *)in_stack_fffffffffffff988,(CScript *)in_stack_fffffffffffff980);
  CScript::~CScript((CScript *)in_stack_fffffffffffff978);
  pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff988,
                      (size_type)in_stack_fffffffffffff980);
  pvVar2->nValue = 1000000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff988,
             (size_type)in_stack_fffffffffffff980);
  CScript::operator=((CScript *)in_stack_fffffffffffff988,(CScript *)in_stack_fffffffffffff980);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff978);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
               (const_string *)in_stack_fffffffffffff9b0,
               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (const_string *)in_stack_fffffffffffff9a0);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
               in_stack_fffffffffffff9b0);
    CTransaction::IsCoinBase((CTransaction *)in_stack_fffffffffffff988);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff988,
               SUB81((ulong)in_stack_fffffffffffff980 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff980,
               (basic_cstring<const_char> *)in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    in_stack_fffffffffffff978 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2e0,local_300,(const_string *)(local_324 + 4),0x25,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff978);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff978);
    CTransaction::~CTransaction((CTransaction *)in_stack_fffffffffffff978);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    test_accept = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
    fTry = (undefined1)((uint)in_stack_fffffffffffff998 >> 0x18);
  } while (bVar1);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff978);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff9b0,
             (char *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
             (char *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff99c,(bool)fTry);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffff978);
  uVar3 = CTxMemPool::size((CTxMemPool *)in_stack_fffffffffffff988);
  local_324._0_4_ = (undefined4)uVar3;
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff978);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)in_stack_fffffffffffff980);
  ChainstateManager::ProcessTransaction
            (in_stack_fffffffffffff9f8,
             (CTransactionRef *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
             (bool)test_accept);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff978);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff978);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
               (const_string *)in_stack_fffffffffffff9b0,
               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (const_string *)in_stack_fffffffffffff9a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff988,
               SUB81((ulong)in_stack_fffffffffffff980 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff980,
               (basic_cstring<const_char> *)in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    in_stack_fffffffffffff978 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_370,local_390,local_3b0,0x2c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff978);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff978);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff978);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
               (const_string *)in_stack_fffffffffffff9b0,
               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (const_string *)in_stack_fffffffffffff9a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff980,(char (*) [1])in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffff978
              );
    local_408 = CTxMemPool::size((CTxMemPool *)in_stack_fffffffffffff988);
    in_stack_fffffffffffff988 = "initialPoolSize";
    in_stack_fffffffffffff980 = (ValidationState<TxValidationResult> *)local_324;
    in_stack_fffffffffffff978 = "m_node.mempool->size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_3f0,local_400,0x2f,1,2,&local_408);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff978);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff978);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
               (const_string *)in_stack_fffffffffffff9b0,
               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (const_string *)in_stack_fffffffffffff9a0);
    ValidationState<TxValidationResult>::IsInvalid
              ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff978);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff988,
               SUB81((ulong)in_stack_fffffffffffff980 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff980,
               (basic_cstring<const_char> *)in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    in_stack_fffffffffffff978 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_440,local_460,local_480,0x32,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff978);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff978);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff978);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
               (const_string *)in_stack_fffffffffffff9b0,
               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (const_string *)in_stack_fffffffffffff9a0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff980,(char (*) [1])in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_(in_stack_fffffffffffff980);
    in_stack_fffffffffffff988 = "\"coinbase\"";
    in_stack_fffffffffffff980 = (ValidationState<TxValidationResult> *)0x1d28505;
    in_stack_fffffffffffff978 = "result.m_state.GetRejectReason()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
              (local_4c0,local_4d0,0x33,1,2,local_238);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff978);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff978);
    in_stack_fffffffffffff9bf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff9bf);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff978);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),file
               ,CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (const_string *)in_stack_fffffffffffff9a0);
    in_stack_fffffffffffff9ac =
         ValidationState<TxValidationResult>::GetResult
                   ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff978);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff988,
               SUB81((ulong)in_stack_fffffffffffff980 >> 0x38,0));
    in_stack_fffffffffffff9a0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff980,
               (basic_cstring<const_char> *)in_stack_fffffffffffff978);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff988,
               (pointer)in_stack_fffffffffffff980,(unsigned_long)in_stack_fffffffffffff978);
    in_stack_fffffffffffff978 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_508,local_528,local_548,0x34,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff978);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff978);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)in_stack_fffffffffffff978);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff978);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff978);
  CScript::~CScript((CScript *)in_stack_fffffffffffff978);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(tx_mempool_reject_coinbase, TestChain100Setup)
{
    CScript scriptPubKey = CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    CMutableTransaction coinbaseTx;

    coinbaseTx.version = 1;
    coinbaseTx.vin.resize(1);
    coinbaseTx.vout.resize(1);
    coinbaseTx.vin[0].scriptSig = CScript() << OP_11 << OP_EQUAL;
    coinbaseTx.vout[0].nValue = 1 * CENT;
    coinbaseTx.vout[0].scriptPubKey = scriptPubKey;

    BOOST_CHECK(CTransaction(coinbaseTx).IsCoinBase());

    LOCK(cs_main);

    unsigned int initialPoolSize = m_node.mempool->size();
    const MempoolAcceptResult result = m_node.chainman->ProcessTransaction(MakeTransactionRef(coinbaseTx));

    BOOST_CHECK(result.m_result_type == MempoolAcceptResult::ResultType::INVALID);

    // Check that the transaction hasn't been added to mempool.
    BOOST_CHECK_EQUAL(m_node.mempool->size(), initialPoolSize);

    // Check that the validation state reflects the unsuccessful attempt.
    BOOST_CHECK(result.m_state.IsInvalid());
    BOOST_CHECK_EQUAL(result.m_state.GetRejectReason(), "coinbase");
    BOOST_CHECK(result.m_state.GetResult() == TxValidationResult::TX_CONSENSUS);
}